

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateCommand.cxx
# Opt level: O2

cmCTestGenericHandler * __thiscall
cmCTestUpdateCommand::InitializeHandler(cmCTestUpdateCommand *this)

{
  cmCTest *pcVar1;
  cmMakefile *pcVar2;
  char *pcVar3;
  cmCTestGenericHandler *this_00;
  string *this_01;
  string source_dir;
  string local_80;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  pcVar3 = (this->super_cmCTestHandlerCommand).Values.
           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_start[4];
  if (pcVar3 == (char *)0x0) {
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::string::string((string *)&local_58,"CTEST_SOURCE_DIRECTORY",&local_59);
    pcVar3 = cmMakefile::GetDefinition(pcVar2,&local_58);
    std::__cxx11::string::string((string *)&local_80,pcVar3,&local_5a);
    cmsys::SystemTools::CollapseFullPath(&local_38,&local_80);
    cmCTest::SetCTestConfiguration
              (pcVar1,"SourceDirectory",local_38._M_dataplus._M_p,
               (this->super_cmCTestHandlerCommand).Quiet);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_80);
    this_01 = &local_58;
  }
  else {
    std::__cxx11::string::string((string *)&local_80,pcVar3,(allocator *)&local_58);
    cmsys::SystemTools::CollapseFullPath(&local_38,&local_80);
    cmCTest::SetCTestConfiguration
              (pcVar1,"SourceDirectory",local_38._M_dataplus._M_p,
               (this->super_cmCTestHandlerCommand).Quiet);
    std::__cxx11::string::~string((string *)&local_38);
    this_01 = &local_80;
  }
  std::__cxx11::string::~string((string *)this_01);
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::string::string((string *)&local_80,"SourceDirectory",(allocator *)&local_58);
  cmCTest::GetCTestConfiguration(&local_38,pcVar1,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::string::string((string *)&local_80,"CTEST_UPDATE_COMMAND",(allocator *)&local_58);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"UpdateCommand",&local_80,(this->super_cmCTestHandlerCommand).Quiet);
  std::__cxx11::string::~string((string *)&local_80);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::string::string((string *)&local_80,"CTEST_UPDATE_OPTIONS",(allocator *)&local_58);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"UpdateOptions",&local_80,(this->super_cmCTestHandlerCommand).Quiet);
  std::__cxx11::string::~string((string *)&local_80);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::string::string((string *)&local_80,"CTEST_CVS_COMMAND",(allocator *)&local_58);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"CVSCommand",&local_80,(this->super_cmCTestHandlerCommand).Quiet);
  std::__cxx11::string::~string((string *)&local_80);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::string::string
            ((string *)&local_80,"CTEST_CVS_UPDATE_OPTIONS",(allocator *)&local_58);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"CVSUpdateOptions",&local_80,(this->super_cmCTestHandlerCommand).Quiet);
  std::__cxx11::string::~string((string *)&local_80);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::string::string((string *)&local_80,"CTEST_SVN_COMMAND",(allocator *)&local_58);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"SVNCommand",&local_80,(this->super_cmCTestHandlerCommand).Quiet);
  std::__cxx11::string::~string((string *)&local_80);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::string::string
            ((string *)&local_80,"CTEST_SVN_UPDATE_OPTIONS",(allocator *)&local_58);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"SVNUpdateOptions",&local_80,(this->super_cmCTestHandlerCommand).Quiet);
  std::__cxx11::string::~string((string *)&local_80);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::string::string((string *)&local_80,"CTEST_SVN_OPTIONS",(allocator *)&local_58);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"SVNOptions",&local_80,(this->super_cmCTestHandlerCommand).Quiet);
  std::__cxx11::string::~string((string *)&local_80);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::string::string((string *)&local_80,"CTEST_BZR_COMMAND",(allocator *)&local_58);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"BZRCommand",&local_80,(this->super_cmCTestHandlerCommand).Quiet);
  std::__cxx11::string::~string((string *)&local_80);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::string::string
            ((string *)&local_80,"CTEST_BZR_UPDATE_OPTIONS",(allocator *)&local_58);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"BZRUpdateOptions",&local_80,(this->super_cmCTestHandlerCommand).Quiet);
  std::__cxx11::string::~string((string *)&local_80);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::string::string((string *)&local_80,"CTEST_GIT_COMMAND",(allocator *)&local_58);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"GITCommand",&local_80,(this->super_cmCTestHandlerCommand).Quiet);
  std::__cxx11::string::~string((string *)&local_80);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::string::string
            ((string *)&local_80,"CTEST_GIT_UPDATE_OPTIONS",(allocator *)&local_58);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"GITUpdateOptions",&local_80,(this->super_cmCTestHandlerCommand).Quiet);
  std::__cxx11::string::~string((string *)&local_80);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::string::string
            ((string *)&local_80,"CTEST_GIT_INIT_SUBMODULES",(allocator *)&local_58);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"GITInitSubmodules",&local_80,(this->super_cmCTestHandlerCommand).Quiet);
  std::__cxx11::string::~string((string *)&local_80);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::string::string((string *)&local_80,"CTEST_GIT_UPDATE_CUSTOM",(allocator *)&local_58)
  ;
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"GITUpdateCustom",&local_80,(this->super_cmCTestHandlerCommand).Quiet);
  std::__cxx11::string::~string((string *)&local_80);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::string::string
            ((string *)&local_80,"CTEST_UPDATE_VERSION_ONLY",(allocator *)&local_58);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"UpdateVersionOnly",&local_80,(this->super_cmCTestHandlerCommand).Quiet);
  std::__cxx11::string::~string((string *)&local_80);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::string::string((string *)&local_80,"CTEST_HG_COMMAND",(allocator *)&local_58);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"HGCommand",&local_80,(this->super_cmCTestHandlerCommand).Quiet);
  std::__cxx11::string::~string((string *)&local_80);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::string::string((string *)&local_80,"CTEST_HG_UPDATE_OPTIONS",(allocator *)&local_58)
  ;
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"HGUpdateOptions",&local_80,(this->super_cmCTestHandlerCommand).Quiet);
  std::__cxx11::string::~string((string *)&local_80);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::string::string((string *)&local_80,"CTEST_P4_COMMAND",(allocator *)&local_58);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"P4Command",&local_80,(this->super_cmCTestHandlerCommand).Quiet);
  std::__cxx11::string::~string((string *)&local_80);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::string::string((string *)&local_80,"CTEST_P4_UPDATE_OPTIONS",(allocator *)&local_58)
  ;
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"P4UpdateOptions",&local_80,(this->super_cmCTestHandlerCommand).Quiet);
  std::__cxx11::string::~string((string *)&local_80);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::string::string((string *)&local_80,"CTEST_P4_CLIENT",(allocator *)&local_58);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"P4Client",&local_80,(this->super_cmCTestHandlerCommand).Quiet);
  std::__cxx11::string::~string((string *)&local_80);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::string::string((string *)&local_80,"CTEST_P4_OPTIONS",(allocator *)&local_58);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"P4Options",&local_80,(this->super_cmCTestHandlerCommand).Quiet);
  std::__cxx11::string::~string((string *)&local_80);
  this_00 = cmCTest::GetInitializedHandler
                      ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"update");
  if (this_00 == (cmCTestGenericHandler *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_80,"internal CTest error. Cannot instantiate update handler",
               (allocator *)&local_58);
    cmCommand::SetError((cmCommand *)this,&local_80);
  }
  else {
    this_00->Command = (cmCTestCommand *)this;
    if (local_38._M_string_length != 0) {
      std::__cxx11::string::string((string *)&local_80,"SourceDirectory",(allocator *)&local_58);
      cmCTestGenericHandler::SetOption(this_00,&local_80,local_38._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_80);
      this_00->Quiet = (this->super_cmCTestHandlerCommand).Quiet;
      goto LAB_0032dcc2;
    }
    std::__cxx11::string::string
              ((string *)&local_80,"source directory not specified. Please use SOURCE tag",
               (allocator *)&local_58);
    cmCommand::SetError((cmCommand *)this,&local_80);
  }
  std::__cxx11::string::~string((string *)&local_80);
  this_00 = (cmCTestGenericHandler *)0x0;
LAB_0032dcc2:
  std::__cxx11::string::~string((string *)&local_38);
  return this_00;
}

Assistant:

cmCTestGenericHandler* cmCTestUpdateCommand::InitializeHandler()
{
  if (this->Values[ct_SOURCE]) {
    this->CTest->SetCTestConfiguration(
      "SourceDirectory",
      cmSystemTools::CollapseFullPath(this->Values[ct_SOURCE]).c_str(),
      this->Quiet);
  } else {
    this->CTest->SetCTestConfiguration(
      "SourceDirectory",
      cmSystemTools::CollapseFullPath(
        this->Makefile->GetDefinition("CTEST_SOURCE_DIRECTORY"))
        .c_str(),
      this->Quiet);
  }
  std::string source_dir =
    this->CTest->GetCTestConfiguration("SourceDirectory");

  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "UpdateCommand", "CTEST_UPDATE_COMMAND", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "UpdateOptions", "CTEST_UPDATE_OPTIONS", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "CVSCommand", "CTEST_CVS_COMMAND", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "CVSUpdateOptions", "CTEST_CVS_UPDATE_OPTIONS",
    this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "SVNCommand", "CTEST_SVN_COMMAND", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "SVNUpdateOptions", "CTEST_SVN_UPDATE_OPTIONS",
    this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "SVNOptions", "CTEST_SVN_OPTIONS", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "BZRCommand", "CTEST_BZR_COMMAND", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "BZRUpdateOptions", "CTEST_BZR_UPDATE_OPTIONS",
    this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "GITCommand", "CTEST_GIT_COMMAND", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "GITUpdateOptions", "CTEST_GIT_UPDATE_OPTIONS",
    this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "GITInitSubmodules", "CTEST_GIT_INIT_SUBMODULES",
    this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "GITUpdateCustom", "CTEST_GIT_UPDATE_CUSTOM", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "UpdateVersionOnly", "CTEST_UPDATE_VERSION_ONLY",
    this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "HGCommand", "CTEST_HG_COMMAND", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "HGUpdateOptions", "CTEST_HG_UPDATE_OPTIONS", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "P4Command", "CTEST_P4_COMMAND", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "P4UpdateOptions", "CTEST_P4_UPDATE_OPTIONS", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "P4Client", "CTEST_P4_CLIENT", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "P4Options", "CTEST_P4_OPTIONS", this->Quiet);

  cmCTestGenericHandler* handler =
    this->CTest->GetInitializedHandler("update");
  if (!handler) {
    this->SetError("internal CTest error. Cannot instantiate update handler");
    return CM_NULLPTR;
  }
  handler->SetCommand(this);
  if (source_dir.empty()) {
    this->SetError("source directory not specified. Please use SOURCE tag");
    return CM_NULLPTR;
  }
  handler->SetOption("SourceDirectory", source_dir.c_str());
  handler->SetQuiet(this->Quiet);
  return handler;
}